

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O1

void file_callback(log_Event *ev)

{
  size_t sVar1;
  char buf [64];
  char acStack_58 [72];
  
  sVar1 = strftime(acStack_58,0x40,"%Y-%m-%d %H:%M:%S",(tm *)ev->time);
  acStack_58[sVar1] = '\0';
  fprintf((FILE *)ev->udata,"%s %-5s %s:%d: ",acStack_58,level_strings[ev->level],ev->file,
          (ulong)(uint)ev->line);
  vfprintf((FILE *)ev->udata,ev->fmt,ev);
  fputc(10,(FILE *)ev->udata);
  fflush((FILE *)ev->udata);
  return;
}

Assistant:

static void file_callback(log_Event *ev) {
  char buf[64];
  buf[strftime(buf, sizeof(buf), "%Y-%m-%d %H:%M:%S", ev->time)] = '\0';
  fprintf(
    ev->udata, "%s %-5s %s:%d: ",
    buf, level_strings[ev->level], ev->file, ev->line);
  vfprintf(ev->udata, ev->fmt, ev->ap);
  fprintf(ev->udata, "\n");
  fflush(ev->udata);
}